

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_do(Curl_easy *data,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  IMAP *pIVar2;
  connectdata *conn;
  FILEPROTO *pFVar3;
  bool bVar4;
  _Bool _Var5;
  char cVar6;
  CURLcode CVar7;
  int iVar8;
  CURLcode CVar9;
  uint uVar10;
  curl_off_t cVar11;
  Curl_easy *pCVar12;
  long lVar13;
  size_t sVar14;
  char *pcVar15;
  connectdata *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *value;
  char *name;
  char *local_68;
  Curl_easy *local_60;
  size_t local_58;
  dynbuf local_50;
  
  *done = false;
  pIVar2 = (data->req).p.imap;
  pcVar17 = (data->state).up.path;
  lVar13 = 1;
  pcVar15 = pcVar17;
  do {
    pcVar18 = pcVar15;
    pcVar15 = pcVar18 + 1;
    _Var5 = imap_is_bchar(pcVar18[1]);
    lVar13 = lVar13 + -1;
  } while (_Var5);
  if (lVar13 == 0) {
    pIVar2->mailbox = (char *)0x0;
  }
  else {
    pcVar17 = pcVar17 + 1;
    if (*pcVar18 != '/') {
      pcVar18 = pcVar15;
    }
    CVar7 = Curl_urldecode(pcVar17,(long)pcVar18 - (long)pcVar17,&pIVar2->mailbox,(size_t *)0x0,
                           REJECT_CTRL);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
  }
  cVar6 = *pcVar15;
  while (cVar6 == ';') {
    pcVar17 = pcVar15 + 1;
    pcVar18 = pcVar15 + 2;
    sVar14 = 0;
    pcVar15 = pcVar17;
    while( true ) {
      if (pcVar18[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar18[-1] == '=') break;
      pcVar18 = pcVar18 + 1;
      sVar14 = sVar14 + 1;
      pcVar15 = pcVar15 + 1;
    }
    local_60 = data;
    CVar7 = Curl_urldecode(pcVar17,sVar14,&local_50.bufr,(size_t *)0x0,REJECT_CTRL);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    sVar14 = 0xffffffffffffffff;
    do {
      pcVar17 = pcVar15 + 1;
      pcVar15 = pcVar15 + 1;
      _Var5 = imap_is_bchar(*pcVar17);
      sVar14 = sVar14 + 1;
    } while (_Var5);
    CVar7 = Curl_urldecode(pcVar18,sVar14,&local_68,&local_58,REJECT_CTRL);
    if (CVar7 != CURLE_OK) {
      (*Curl_cfree)(local_50.bufr);
      return CVar7;
    }
    iVar8 = curl_strequal(local_50.bufr,"UIDVALIDITY");
    if ((iVar8 == 0) || (pIVar2->uidvalidity != (char *)0x0)) {
      iVar8 = curl_strequal(local_50.bufr,"UID");
      if ((iVar8 == 0) || (pIVar2->uid != (char *)0x0)) {
        iVar8 = curl_strequal(local_50.bufr,"MAILINDEX");
        if ((iVar8 == 0) || (pIVar2->mindex != (char *)0x0)) {
          iVar8 = curl_strequal(local_50.bufr,"SECTION");
          data = local_60;
          if ((iVar8 == 0) || (pIVar2->section != (char *)0x0)) {
            iVar8 = curl_strequal(local_50.bufr,"PARTIAL");
            if ((iVar8 == 0) || (pIVar2->partial != (char *)0x0)) {
              (*Curl_cfree)(local_50.bufr);
              (*Curl_cfree)(local_68);
              return CURLE_URL_MALFORMAT;
            }
            if ((local_58 != 0) && (local_68[local_58 - 1] == '/')) {
              local_68[local_58 - 1] = '\0';
            }
            pIVar2->partial = local_68;
          }
          else {
            if ((local_58 != 0) && (local_68[local_58 - 1] == '/')) {
              local_68[local_58 - 1] = '\0';
            }
            pIVar2->section = local_68;
          }
        }
        else {
          if ((local_58 != 0) && (local_68[local_58 - 1] == '/')) {
            local_68[local_58 - 1] = '\0';
          }
          pIVar2->mindex = local_68;
          data = local_60;
        }
      }
      else {
        if ((local_58 != 0) && (local_68[local_58 - 1] == '/')) {
          local_68[local_58 - 1] = '\0';
        }
        pIVar2->uid = local_68;
        data = local_60;
      }
    }
    else {
      if ((local_58 != 0) && (local_68[local_58 - 1] == '/')) {
        local_68[local_58 - 1] = '\0';
      }
      pIVar2->uidvalidity = local_68;
      data = local_60;
    }
    local_68 = (char *)0x0;
    (*Curl_cfree)(local_50.bufr);
    (*Curl_cfree)(local_68);
    cVar6 = *pcVar15;
  }
  if (((pIVar2->mailbox != (char *)0x0) && (pIVar2->uid == (char *)0x0)) &&
     (pIVar2->mindex == (char *)0x0)) {
    curl_url_get((data->state).uh,CURLUPART_QUERY,&pIVar2->query,0x40);
    cVar6 = *pcVar15;
  }
  if (cVar6 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pcVar17 = (data->set).str[0x1c];
  if (pcVar17 != (char *)0x0) {
    pIVar2 = (data->req).p.imap;
    CVar7 = Curl_urldecode(pcVar17,0,&pIVar2->custom,(size_t *)0x0,REJECT_CTRL);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    pcVar17 = pIVar2->custom;
    pcVar15 = pcVar17;
    for (; *pcVar17 != '\0'; pcVar17 = pcVar17 + 1) {
      if (*pcVar17 == ' ') {
        pcVar17 = (*Curl_cstrdup)(pcVar17);
        pIVar2->custom_params = pcVar17;
        *pcVar15 = '\0';
        if (pIVar2->custom_params == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar15 = pcVar15 + 1;
    }
  }
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  conn = data->conn;
  pIVar2 = (data->req).p.imap;
  if (((data->req).field_0xd3 & 2) != 0) {
    pIVar2->transfer = PPTRANSFER_INFO;
  }
  *done = false;
  if ((((pIVar2->mailbox == (char *)0x0) ||
       (pcVar17 = (conn->proto).imapc.mailbox, pcVar17 == (char *)0x0)) ||
      (iVar8 = curl_strequal(pIVar2->mailbox,pcVar17), iVar8 == 0)) ||
     (((pIVar2->uidvalidity != (char *)0x0 &&
       (pcVar17 = (conn->proto).ftpc.server_os, pcVar17 != (char *)0x0)) &&
      (iVar8 = curl_strequal(pIVar2->uidvalidity,pcVar17), iVar8 == 0)))) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
  }
  if ((((data->state).field_0x7c0 & 8) == 0) && ((data->set).mimepost.kind == MIMEKIND_NONE)) {
    if (pIVar2->custom == (char *)0x0) {
      if (bVar4) {
        if ((pIVar2->uid == (char *)0x0) && (pIVar2->mindex == (char *)0x0)) {
          if (pIVar2->query == (char *)0x0) goto LAB_0013dd36;
          CVar7 = imap_perform_search(data);
        }
        else {
          CVar7 = imap_perform_fetch(data);
        }
        goto LAB_0013dd40;
      }
      if (pIVar2->mailbox != (char *)0x0) {
        if ((pIVar2->uid == (char *)0x0) && (pIVar2->mindex == (char *)0x0)) {
          pcVar17 = pIVar2->query;
          goto joined_r0x0013dbe1;
        }
        goto LAB_0013dbe7;
      }
    }
    else if (!bVar4) {
      pcVar17 = pIVar2->mailbox;
joined_r0x0013dbe1:
      if (pcVar17 != (char *)0x0) {
LAB_0013dbe7:
        pcVar16 = data->conn;
        local_60 = (Curl_easy *)(data->req).p.file;
        (*Curl_cfree)((pcVar16->proto).imapc.mailbox);
        (pcVar16->proto).ftpc.retr_size_saved = 0;
        (*Curl_cfree)((pcVar16->proto).ftpc.server_os);
        (pcVar16->proto).ftpc.server_os = (char *)0x0;
        if ((char *)local_60->id == (char *)0x0) {
          Curl_failf(data,"Cannot SELECT without a mailbox.");
          return CURLE_URL_MALFORMAT;
        }
        pcVar17 = imap_atom((char *)local_60->id,false);
        if (pcVar17 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar7 = imap_sendf(data,"SELECT %s",pcVar17);
        (*Curl_cfree)(pcVar17);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        pcVar16 = data->conn;
        (pcVar16->proto).imapc.state = IMAP_SELECT;
        goto LAB_0013dd4c;
      }
    }
LAB_0013dd36:
    CVar7 = imap_perform_list(data);
  }
  else {
    pFVar3 = (data->req).p.file;
    if (pFVar3->freepath == (char *)0x0) {
      Curl_failf(data,"Cannot APPEND without a mailbox.");
      CVar7 = CURLE_URL_MALFORMAT;
    }
    else if ((data->set).mimepost.kind == MIMEKIND_NONE) {
      CVar7 = Curl_creader_set_fread(data,(data->state).infilesize);
      if (CVar7 == CURLE_OK) {
        cVar11 = (data->state).infilesize;
        goto LAB_0013da01;
      }
    }
    else {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      CVar7 = Curl_mime_prepare_headers(data,part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if ((CVar7 == CURLE_OK) &&
         (((pcVar17 = Curl_checkheaders(data,"Mime-Version",0xc), pcVar17 != (char *)0x0 ||
           (CVar7 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0"),
           CVar7 == CURLE_OK)) && (CVar7 = Curl_creader_set_mime(data,part), CVar7 == CURLE_OK)))) {
        cVar11 = Curl_creader_client_length(data);
        (data->state).infilesize = cVar11;
LAB_0013da01:
        if (cVar11 < 0) {
          Curl_failf(data,"Cannot APPEND with unknown input file size");
          CVar7 = CURLE_UPLOAD_FAILED;
        }
        else {
          pCVar12 = (Curl_easy *)imap_atom(pFVar3->freepath,false);
          if (pCVar12 == (Curl_easy *)0x0) {
            CVar7 = CURLE_OUT_OF_MEMORY;
          }
          else {
            Curl_dyn_init(&local_50,100);
            if ((data->set).upload_flags == '\0') {
              CVar9 = Curl_dyn_add(&local_50,"");
              CVar7 = CURLE_OK;
joined_r0x0013dcc5:
              if (CVar9 == CURLE_OK) {
                pcVar17 = Curl_dyn_ptr(&local_50);
                CVar7 = imap_sendf(data,"APPEND %s%s {%ld}",pCVar12,pcVar17,(data->state).infilesize
                                  );
              }
            }
            else {
              CVar9 = Curl_dyn_add(&local_50," (");
              CVar7 = CURLE_OUT_OF_MEMORY;
              if (CVar9 == CURLE_OK) {
                uVar10 = 1;
                lVar13 = 0x10;
                local_60 = pCVar12;
                do {
                  if (((uVar10 & (data->set).upload_flags) != 0) &&
                     (((sVar14 = Curl_dyn_len(&local_50), 2 < sVar14 &&
                       (CVar9 = Curl_dyn_add(&local_50," "), pCVar12 = local_60, CVar9 != CURLE_OK))
                      || ((CVar9 = Curl_dyn_add(&local_50,"\\"), pCVar12 = local_60,
                          CVar9 != CURLE_OK ||
                          (CVar9 = Curl_dyn_add(&local_50,
                                                *(char **)((long)&saslimap.defmechs + lVar13)),
                          pCVar12 = local_60, CVar9 != CURLE_OK)))))) goto LAB_0013dcf8;
                  uVar10 = *(uint *)(&DAT_0019f510 + lVar13);
                  lVar13 = lVar13 + 0x10;
                } while (lVar13 != 0x60);
                CVar9 = Curl_dyn_add(&local_50,")");
                pCVar12 = local_60;
                goto joined_r0x0013dcc5;
              }
            }
LAB_0013dcf8:
            Curl_dyn_free(&local_50);
            (*Curl_cfree)(pCVar12);
            if (CVar7 == CURLE_OK) {
              (data->conn->proto).imapc.state = IMAP_APPEND;
              CVar7 = CURLE_OK;
            }
          }
        }
      }
    }
  }
LAB_0013dd40:
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
  pcVar16 = data->conn;
LAB_0013dd4c:
  CVar7 = Curl_pp_statemach(data,&(pcVar16->proto).ftpc.pp,false,false);
  *done = (pcVar16->proto).imapc.state == IMAP_STOP;
  Curl_conn_is_connected(conn,0);
  if (((CVar7 == CURLE_OK) && (CVar7 = CURLE_OK, *done == true)) &&
     (CVar7 = CURLE_OK, ((data->req).p.imap)->transfer != PPTRANSFER_BODY)) {
    Curl_xfer_setup_nop(data);
  }
  return CVar7;
}

Assistant:

static CURLcode imap_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(data);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(data);
  if(result)
    return result;

  result = imap_regular_transfer(data, done);

  return result;
}